

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_util.cpp
# Opt level: O3

json json_read_safe(json *j,string *key,string *default_to)

{
  bool bVar1;
  int iVar2;
  reference other;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined4 *puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  json_value extraout_RDX;
  json jVar6;
  value_type data_item;
  undefined1 local_50 [8];
  json_value local_48;
  undefined1 local_40 [8];
  json_value local_38;
  
  other = nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)key,default_to);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_50,other);
  local_40[0] = null;
  local_38.object = (object_t *)0x0;
  bVar1 = nlohmann::operator==((const_reference)local_50,(const_reference)local_40);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_40 + 8),local_40[0]);
  if (bVar1) {
    iVar2 = std::__cxx11::string::compare((char *)in_RCX);
    if (iVar2 == 0) {
      puVar5 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar5 = 0x16;
      __cxa_throw(puVar5,&int::typeinfo,0);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Key: ",5);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(default_to->_M_dataplus)._M_p,
                        default_to->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," not found. Defaulting to: ",0x1b);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,(in_RCX->_M_dataplus)._M_p,in_RCX->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," method",7);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    (j->m_value).object = (object_t *)0x0;
    j->m_type = string;
    pbVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::create<std::__cxx11::string,std::__cxx11::string>(in_RCX);
    (j->m_value).object = (object_t *)pbVar4;
  }
  else {
    j->m_type = local_50[0];
    j->m_value = local_48;
    local_50[0] = null;
    local_48.object = (object_t *)0x0;
  }
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_50 + 8),local_50[0]);
  jVar6.m_value.object = extraout_RDX.object;
  jVar6._0_8_ = j;
  return jVar6;
}

Assistant:

json json_read_safe(json j, string key, string default_to){

    try {
        auto data_item = j[key];

        if(data_item==nullptr) {
            if(default_to=="0") throw 22;
            cout<<"Key: "<<key<< " not found. Defaulting to: "<<default_to<<" method"<<endl;
            return default_to;
        }

        return data_item;
    }
    catch (int e)
    {
        // output exception information
        cout<<"Error. Key '"<<key<<"' does not exist!"<<endl;
        exit(23);
    }

}